

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::ThriftSender_testManyMessages_Test::TestBody
          (ThriftSender_testManyMessages_Test *this)

{
  string_view name;
  char cVar1;
  int iVar2;
  UDPTransporter *this_00;
  allocator local_38d;
  int local_38c;
  long *local_388;
  UDPTransporter *local_380;
  time_point local_378;
  time_point local_370;
  shared_ptr<const_jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  string local_348;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_328;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_308;
  SpanContext local_2e8;
  ThriftSender sender;
  Span span;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198 [45];
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer_const,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)&tracer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
  this_00 = (UDPTransporter *)operator_new(0xc0);
  memcpy((IPAddress *)&span,
         (void *)(*(long *)handle.
                           super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 0x30),0x88);
  jaegertracing::utils::UDPTransporter::UDPTransporter(this_00,(IPAddress *)&span,0);
  local_380 = this_00;
  jaegertracing::ThriftSender::ThriftSender(&sender,(unique_ptr *)&local_380);
  jaegertracing::logging::consoleLogger();
  iVar2 = 0;
  do {
    if (iVar2 == 2000) {
LAB_001b0374:
      if (local_388 != (long *)0x0) {
        (**(code **)(*local_388 + 8))();
      }
      ThriftSender::~ThriftSender(&sender);
      if (local_380 != (UDPTransporter *)0x0) {
        (*(local_380->super_Transport)._vptr_Transport[1])();
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&handle.
                  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    local_2e8.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0021e2e8;
    local_2e8._flags = '\0';
    local_2e8._spanID = 0;
    local_2e8._parentID = 0;
    local_2e8._traceID._high = 0;
    local_2e8._traceID._low = 0;
    local_2e8._baggage._M_h._M_buckets = &local_2e8._baggage._M_h._M_single_bucket;
    local_2e8._baggage._M_h._M_bucket_count = 1;
    local_2e8._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2e8._baggage._M_h._M_element_count = 0;
    local_2e8._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2e8._baggage._M_h._M_rehash_policy._M_next_resize = 0;
    local_2e8._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2e8._debugID._M_dataplus._M_p = (pointer)&local_2e8._debugID.field_2;
    local_2e8._debugID._M_string_length = 0;
    local_2e8._debugID.field_2._M_local_buf[0] = '\0';
    local_2e8._mutex.super___mutex_base._M_mutex._16_8_ = 0;
    local_2e8._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    local_2e8._mutex.super___mutex_base._M_mutex.__align = 0;
    local_2e8._mutex.super___mutex_base._M_mutex._8_8_ = 0;
    local_2e8._mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    local_38c = iVar2;
    std::__cxx11::string::string((string *)&local_348,"",&local_38d);
    local_370.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_378.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_308.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Span::Span(&span,&tracer,&local_2e8,&local_348,&local_370,&local_378,&local_308,&local_328);
    std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
              (&local_328);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_308);
    std::__cxx11::string::~string((string *)&local_348);
    SpanContext::~SpanContext(&local_2e8);
    std::__cxx11::to_string(&local_348,local_38c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e8,
                   "test",&local_348);
    name.length_ = local_2e8._traceID._high;
    name.data_ = (char *)local_2e8.super_SpanContext._vptr_SpanContext;
    Span::SetOperationName(&span,name);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_348);
    cVar1 = testing::internal::AlwaysTrue();
    if (cVar1 == '\0') {
      testing::Message::Message((Message *)&local_2e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_348,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
                 ,0x54,
                 "Expected: sender.append(span) doesn\'t throw an exception.\n  Actual: it throws.")
      ;
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_2e8);
      Span::~Span(&span);
      goto LAB_001b0374;
    }
    cVar1 = testing::internal::AlwaysTrue();
    if (cVar1 != '\0') {
      jaegertracing::ThriftSender::append((Span *)&sender);
    }
    Span::~Span(&span);
    iVar2 = local_38c + 1;
  } while( true );
}

Assistant:

TEST(ThriftSender, testManyMessages)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    std::unique_ptr<utils::Transport> transporter(
        new utils::UDPTransporter(handle->_mockAgent->spanServerAddress(), 0));
    ThriftSender sender(
        std::forward<std::unique_ptr<utils::Transport>>(transporter));
    constexpr auto kNumMessages = 2000;
    const auto logger = logging::consoleLogger();
    for (auto i = 0; i < kNumMessages; ++i) {
        Span span(tracer);
        span.SetOperationName("test" + std::to_string(i));
        ASSERT_NO_THROW(sender.append(span));
    }
}